

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::CleanVertexArray
          (StorageMultisampleTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  StorageMultisampleTest *this_local;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_vao != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0xd8))(0);
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  return;
}

Assistant:

void StorageMultisampleTest::CleanVertexArray()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_vao)
	{
		gl.bindVertexArray(0);

		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}
}